

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

void device_cb(void *arg)

{
  undefined8 *item;
  nng_err rv;
  int iVar1;
  nni_msg *m;
  int iVar2;
  nni_aio *pnVar3;
  long lVar4;
  
  item = *(undefined8 **)((long)arg + 8);
  pnVar3 = (nni_aio *)((long)arg + 0x20);
  rv = nni_aio_result(pnVar3);
  if (rv != NNG_OK) {
    nni_mtx_lock(&device_mtx);
    if (*arg == 2) {
      m = nni_aio_get_msg(pnVar3);
      nni_msg_free(m);
      nni_aio_set_msg(pnVar3,(nni_msg *)0x0);
    }
    *(undefined4 *)arg = 3;
    iVar2 = *(int *)((long)item + 0xc) + -1;
    *(int *)((long)item + 0xc) = iVar2;
    if (*(int *)(item + 2) == 0) {
      *(nng_err *)(item + 2) = rv;
    }
    iVar1 = *(int *)(item + 1);
    if (0 < iVar1) {
      pnVar3 = (nni_aio *)(item + 7);
      lVar4 = 0;
      do {
        if (&pnVar3[-1].a_expire_q != (nni_aio_expire_q **)arg) {
          nni_aio_abort(pnVar3,rv);
          iVar1 = *(int *)(item + 1);
        }
        lVar4 = lVar4 + 1;
        pnVar3 = (nni_aio *)&pnVar3[1].a_task;
      } while (lVar4 < iVar1);
      iVar2 = *(int *)((long)item + 0xc);
    }
    if (iVar2 == 0) {
      if ((nni_aio *)*item != (nni_aio *)0x0) {
        nni_aio_finish_error((nni_aio *)*item,*(nng_err *)(item + 2));
        *item = 0;
      }
      nni_reap(&device_reap,item);
    }
    nni_mtx_unlock(&device_mtx);
    return;
  }
  if (*arg != 1) {
    if (*arg == 2) {
      *(undefined4 *)arg = 1;
      nni_sock_recv(*(nni_sock **)((long)arg + 0x10),pnVar3);
      return;
    }
    return;
  }
  *(undefined4 *)arg = 2;
  nni_sock_send(*(nni_sock **)((long)arg + 0x18),pnVar3);
  return;
}

Assistant:

static void
device_cb(void *arg)
{
	device_path *p = arg;
	device_data *d = p->d;
	int          rv;

	if ((rv = nni_aio_result(&p->aio)) != 0) {
		nni_mtx_lock(&device_mtx);
		if (p->state == NNI_DEVICE_STATE_SEND) {
			nni_msg_free(nni_aio_get_msg(&p->aio));
			nni_aio_set_msg(&p->aio, NULL);
		}
		p->state = NNI_DEVICE_STATE_FINI;
		d->running--;
		if (d->rv == 0) {
			d->rv = rv;
		}
		for (int i = 0; i < d->num_paths; i++) {
			if (p != &d->paths[i]) {
				nni_aio_abort(&d->paths[i].aio, rv);
			}
		}
		if (d->running == 0) {
			if (d->user != NULL) {
				nni_aio_finish_error(d->user, d->rv);
				d->user = NULL;
			}

			nni_reap(&device_reap, d);
		}
		nni_mtx_unlock(&device_mtx);
		return;
	}

	switch (p->state) {
	case NNI_DEVICE_STATE_INIT:
		break;
	case NNI_DEVICE_STATE_SEND:
		p->state = NNI_DEVICE_STATE_RECV;
		nni_sock_recv(p->src, &p->aio);
		break;
	case NNI_DEVICE_STATE_RECV:
		// Leave the message where it is.
		p->state = NNI_DEVICE_STATE_SEND;
		nni_sock_send(p->dst, &p->aio);
		break;
	case NNI_DEVICE_STATE_FINI:
		break;
	}
}